

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  
  if (this != other) {
    pcVar1 = (this->super_buffer<char>).ptr_;
    if (pcVar1 != this->store_) {
      operator_delete(pcVar1,(this->super_buffer<char>).capacity_);
    }
    move(this,other);
    return this;
  }
  detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format.h"
                      ,0x2cf,"");
}

Assistant:

auto operator=(basic_memory_buffer&& other) FMT_NOEXCEPT
      -> basic_memory_buffer& {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }